

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O2

void duckdb::FlipChildren(LogicalOperator *op)

{
  LogicalOperatorType LVar1;
  pointer pLVar2;
  ExpressionType EVar3;
  JoinType JVar4;
  reference __a;
  reference __b;
  InternalException *this;
  LogicalComparisonJoin *join;
  JoinCondition *cond;
  pointer __a_00;
  allocator local_41;
  string local_40;
  
  __a = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
        ::get<true>(&op->children,0);
  __b = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
        ::get<true>(&op->children,1);
  ::std::
  swap<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            (__a,__b);
  LVar1 = op->type;
  if (LVar1 - 0x33 < 2) {
    JVar4 = InverseJoinType(op->field_0x61);
    op->field_0x61 = JVar4;
    pLVar2 = (pointer)op[1].estimated_cardinality;
    for (__a_00 = op[1].types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage; __a_00 != pLVar2;
        __a_00 = __a_00 + 1) {
      ::std::
      swap<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 __a_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&__a_00->type_info_);
      EVar3 = FlipComparisonExpression
                        (*(ExpressionType *)
                          &(__a_00->type_info_).internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
      *(ExpressionType *)
       &(__a_00->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           EVar3;
    }
  }
  else {
    if (LVar1 != LOGICAL_ANY_JOIN) {
      if (LVar1 == LOGICAL_CROSS_PRODUCT) {
        return;
      }
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Flipping children, but children were not flipped",&local_41);
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    op = (LogicalOperator *)LogicalOperator::Cast<duckdb::LogicalAnyJoin>(op);
    JVar4 = InverseJoinType((((LogicalAnyJoin *)op)->super_LogicalJoin).super_LogicalOperator.
                            field_0x61);
    (((LogicalAnyJoin *)op)->super_LogicalJoin).super_LogicalOperator.field_0x61 = JVar4;
  }
  ::std::swap<duckdb::vector<unsigned_long,true>>
            (&(((LogicalAnyJoin *)op)->super_LogicalJoin).left_projection_map,
             &(((LogicalAnyJoin *)op)->super_LogicalJoin).right_projection_map);
  return;
}

Assistant:

static void FlipChildren(LogicalOperator &op) {
	std::swap(op.children[0], op.children[1]);
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
		auto &join = op.Cast<LogicalComparisonJoin>();
		join.join_type = InverseJoinType(join.join_type);
		for (auto &cond : join.conditions) {
			std::swap(cond.left, cond.right);
			cond.comparison = FlipComparisonExpression(cond.comparison);
		}
		std::swap(join.left_projection_map, join.right_projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		auto &join = op.Cast<LogicalAnyJoin>();
		join.join_type = InverseJoinType(join.join_type);
		std::swap(join.left_projection_map, join.right_projection_map);
		return;
	}
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT: {
		// don't need to do anything here
		return;
	}
	default:
		throw InternalException("Flipping children, but children were not flipped");
	}
}